

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O0

void __thiscall string_view_back_Test::TestBody(string_view_back_Test *this)

{
  bool bVar1;
  const_reference rhs;
  char *message;
  AssertHelper local_48;
  Message local_40;
  char local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  string_view sv;
  string_view_back_Test *this_local;
  
  wabt::string_view::string_view((string_view *)&gtest_ar.message_,"words");
  local_31 = 's';
  rhs = wabt::string_view::back((string_view *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char,char>
            ((EqHelper<false> *)local_30,"\'s\'","sv.back()",&local_31,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-string-view.cc"
               ,0xae,message);
    testing::internal::AssertHelper::operator=(&local_48,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

TEST(string_view, back) {
  string_view sv("words");
  ASSERT_EQ('s', sv.back());
}